

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool libcellml::Variable::addEquivalence
               (VariablePtr *variable1,VariablePtr *variable2,string *mappingId,string *connectionId
               )

{
  bool bVar1;
  element_type *peVar2;
  VariableImpl *pVVar3;
  bool added;
  string *connectionId_local;
  string *mappingId_local;
  VariablePtr *variable2_local;
  VariablePtr *variable1_local;
  
  bVar1 = addEquivalence(variable1,variable2);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable1);
  pVVar3 = pFunc(peVar2);
  VariableImpl::setEquivalentMappingId(pVVar3,variable2,mappingId);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable1);
  pVVar3 = pFunc(peVar2);
  VariableImpl::setEquivalentConnectionId(pVVar3,variable2,connectionId);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable2);
  pVVar3 = pFunc(peVar2);
  VariableImpl::setEquivalentMappingId(pVVar3,variable1,mappingId);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable2);
  pVVar3 = pFunc(peVar2);
  VariableImpl::setEquivalentConnectionId(pVVar3,variable1,connectionId);
  return bVar1;
}

Assistant:

bool Variable::addEquivalence(const VariablePtr &variable1, const VariablePtr &variable2, const std::string &mappingId, const std::string &connectionId)
{
    bool added = Variable::addEquivalence(variable1, variable2);
    variable1->pFunc()->setEquivalentMappingId(variable2, mappingId);
    variable1->pFunc()->setEquivalentConnectionId(variable2, connectionId);
    variable2->pFunc()->setEquivalentMappingId(variable1, mappingId);
    variable2->pFunc()->setEquivalentConnectionId(variable1, connectionId);

    return added;
}